

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::gjInverse(Matrix33<float> *this,bool singExc)

{
  invalid_argument *piVar1;
  float *pfVar2;
  byte in_DL;
  Matrix33<float> *in_RSI;
  Matrix33<float> *in_RDI;
  float fVar3;
  float f_1;
  float f;
  float tmp_1;
  float tmp;
  float pivotsize;
  int pivot;
  Matrix33<float> t;
  Matrix33<float> s;
  int k;
  int j;
  int i;
  float local_74;
  float local_70;
  int local_6c;
  Matrix33<float> local_68;
  Matrix33<float> local_44;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Matrix33(&local_44);
  Matrix33(&local_68,in_RSI);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    local_6c = local_18;
    local_70 = local_68.x[local_18][local_18];
    if (local_70 < 0.0) {
      local_70 = -local_70;
    }
    for (local_1c = local_18 + 1; local_1c < 3; local_1c = local_1c + 1) {
      local_74 = local_68.x[local_1c][local_18];
      if (local_74 < 0.0) {
        local_74 = -local_74;
      }
      if (local_70 < local_74) {
        local_6c = local_1c;
        local_70 = local_74;
      }
    }
    if ((local_70 == 0.0) && (!NAN(local_70))) {
      if ((local_11 & 1) == 0) {
        Matrix33(in_RDI);
        return in_RDI;
      }
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"Cannot invert singular matrix.");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_6c != local_18) {
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        fVar3 = local_68.x[local_18][local_1c];
        local_68.x[local_18][local_1c] = local_68.x[local_6c][local_1c];
        local_68.x[local_6c][local_1c] = fVar3;
        fVar3 = local_44.x[local_18][local_1c];
        local_44.x[local_18][local_1c] = local_44.x[local_6c][local_1c];
        local_44.x[local_6c][local_1c] = fVar3;
      }
    }
    for (local_1c = local_18 + 1; local_1c < 3; local_1c = local_1c + 1) {
      fVar3 = local_68.x[local_1c][local_18] / local_68.x[local_18][local_18];
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        local_68.x[local_1c][local_20] =
             -fVar3 * local_68.x[local_18][local_20] + local_68.x[local_1c][local_20];
        local_44.x[local_1c][local_20] =
             -fVar3 * local_44.x[local_18][local_20] + local_44.x[local_1c][local_20];
      }
    }
  }
  local_18 = 2;
  while( true ) {
    if (local_18 < 0) {
      Matrix33(in_RDI,&local_44);
      return in_RDI;
    }
    pfVar2 = operator[](&local_68,local_18);
    fVar3 = pfVar2[local_18];
    if ((fVar3 == 0.0) && (!NAN(fVar3))) break;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      local_68.x[local_18][local_1c] = local_68.x[local_18][local_1c] / fVar3;
      local_44.x[local_18][local_1c] = local_44.x[local_18][local_1c] / fVar3;
    }
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      fVar3 = local_68.x[local_1c][local_18];
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        local_68.x[local_1c][local_20] =
             -fVar3 * local_68.x[local_18][local_20] + local_68.x[local_1c][local_20];
        local_44.x[local_1c][local_20] =
             -fVar3 * local_44.x[local_18][local_20] + local_44.x[local_1c][local_20];
      }
    }
    local_18 = local_18 + -1;
  }
  if ((local_11 & 1) == 0) {
    Matrix33(in_RDI);
    return in_RDI;
  }
  piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar1,"Cannot invert singular matrix.");
  __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix33 ();
        }

        for (j = 0; j < 3; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 3; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}